

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

ImGuiID __thiscall ImGuiWindow::GetIDFromRectangle(ImGuiWindow *this,ImRect *r_abs)

{
  ImU32 id_00;
  uint *puVar1;
  float *in_RSI;
  long in_RDI;
  ImGuiID id;
  int r_rel [4];
  ImGuiID seed;
  int local_28;
  int local_24;
  int local_20;
  int local_1c;
  ImU32 local_14;
  float *local_10;
  
  local_10 = in_RSI;
  puVar1 = ImVector<unsigned_int>::back((ImVector<unsigned_int> *)(in_RDI + 0x1e8));
  local_14 = *puVar1;
  local_28 = (int)(*local_10 - *(float *)(in_RDI + 0x10));
  local_24 = (int)(local_10[1] - *(float *)(in_RDI + 0x14));
  local_20 = (int)(local_10[2] - *(float *)(in_RDI + 0x10));
  local_1c = (int)(local_10[3] - *(float *)(in_RDI + 0x14));
  id_00 = ImHash(&local_28,0x10,local_14);
  ImGui::KeepAliveID(id_00);
  return id_00;
}

Assistant:

ImGuiID ImGuiWindow::GetIDFromRectangle(const ImRect& r_abs)
{
    ImGuiID seed = IDStack.back();
    const int r_rel[4] = { (int)(r_abs.Min.x - Pos.x), (int)(r_abs.Min.y - Pos.y), (int)(r_abs.Max.x - Pos.x), (int)(r_abs.Max.y - Pos.y) };
    ImGuiID id = ImHash(&r_rel, sizeof(r_rel), seed);
    ImGui::KeepAliveID(id);
    return id;
}